

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_submod(lysp_yin_ctx *ctx,lysp_submodule *submod)

{
  int iVar1;
  lysp_submodule *plVar2;
  undefined8 in_stack_fffffffffffffc48;
  undefined4 uVar3;
  ly_ctx *local_128;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  size_t subelems_size;
  lysp_submodule *dup;
  yin_subelement *subelems;
  lysp_submodule *plStack_48;
  LY_ERR ret;
  lysp_submodule *submod_local;
  lysp_yin_ctx *ctx_local;
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  subelems._4_4_ = 0;
  dup = (lysp_submodule *)0x0;
  submod->field_0x79 = submod->field_0x79 & 0xfd | 2;
  plStack_48 = submod;
  submod_local = (lysp_submodule *)ctx;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if (((ctx_local._4_4_ == LY_SUCCESS) &&
      (ctx_local._4_4_ =
            yin_parse_attribute((lysp_yin_ctx *)submod_local,YIN_ARG_NAME,&plStack_48->name,
                                Y_IDENTIF_ARG,LY_STMT_SUBMODULE), ctx_local._4_4_ == LY_SUCCESS)) &&
     (ctx_local._4_4_ =
           subelems_allocator((lysp_yin_ctx *)submod_local,0x1b,(lysp_node *)0x0,
                              (yin_subelement **)&dup,0x20,&plStack_48->data,CONCAT44(uVar3,8),0x40,
                              &plStack_48->data,0,0x80,&plStack_48->augments,0,0x30000,plStack_48,3,
                              0x200,&plStack_48->data,0,0x60000,&plStack_48->contact,2,0x400,
                              &plStack_48->data,0,0x80000,&plStack_48->dsc,2,0xa0000,
                              &plStack_48->deviations,0,0xe0000,&plStack_48->extensions,0,0x100000,
                              &plStack_48->features,0,0x800,&plStack_48->groupings,0,0x120000,
                              &plStack_48->identities,0,0x140000,plStack_48->prefix,
                              &plStack_48->imports,0,0x150000,plStack_48->name,&plStack_48->includes
                              ,0,0x1000,&plStack_48->data,0,0x2000,&plStack_48->data,0,0x4000,
                              &plStack_48->data,0,1,&plStack_48->notifs,0,0x200000,&plStack_48->org,
                              2,0x270000,&plStack_48->ref,2), ctx_local._4_4_ == LY_SUCCESS)) {
    subelems._4_4_ =
         yin_parse_content((lysp_yin_ctx *)submod_local,(yin_subelement *)dup,0x1b,plStack_48,
                           LY_STMT_SUBMODULE,(char **)0x0,&plStack_48->exts);
    subelems_deallocator(0x1b,(yin_subelement *)dup);
    if (subelems._4_4_ == LY_SUCCESS) {
      ctx_local._4_4_ = yin_unres_exts_add((lysp_yin_ctx *)submod_local,plStack_48->exts);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        plVar2 = ly_ctx_get_submodule_latest((ly_ctx *)submod_local->data->parent,plStack_48->name);
        if ((plVar2 == (lysp_submodule *)0x0) ||
           (iVar1 = strcmp(plVar2->mod->name,plStack_48->mod->name), iVar1 == 0)) {
          ctx_local._4_4_ = LY_SUCCESS;
        }
        else {
          if (submod_local == (lysp_submodule *)0x0) {
            local_128 = (ly_ctx *)0x0;
          }
          else {
            local_128 = *(ly_ctx **)
                         **(undefined8 **)
                           (submod_local->typedefs->units +
                           (ulong)(*(int *)((long)&submod_local->typedefs->name + 4) - 1) * 8);
          }
          ly_vlog(local_128,(char *)0x0,LYVE_SEMANTICS,"Name collision between %s of name \"%s\".",
                  "submodules",plVar2->name);
          ctx_local._4_4_ = LY_EVALID;
        }
      }
    }
    else {
      ctx_local._4_4_ = subelems._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
yin_parse_submod(struct lysp_yin_ctx *ctx, struct lysp_submodule *submod)
{
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    const struct lysp_submodule *dup;
    size_t subelems_size;

    submod->is_submod = 1;

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &submod->name, Y_IDENTIF_ARG, LY_STMT_SUBMODULE));
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 27, NULL, &subelems,
            LY_STMT_ANYDATA, &submod->data, YIN_SUBELEM_VER2,
            LY_STMT_ANYXML, &submod->data, 0,
            LY_STMT_AUGMENT, &submod->augments, 0,
            LY_STMT_BELONGS_TO, submod, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE,
            LY_STMT_CHOICE, &submod->data, 0,
            LY_STMT_CONTACT, &submod->contact, YIN_SUBELEM_UNIQUE,
            LY_STMT_CONTAINER, &submod->data, 0,
            LY_STMT_DESCRIPTION, &submod->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_DEVIATION, &submod->deviations, 0,
            LY_STMT_EXTENSION, &submod->extensions, 0,
            LY_STMT_FEATURE, &submod->features, 0,
            LY_STMT_GROUPING, &submod->groupings, 0,
            LY_STMT_IDENTITY, &submod->identities, 0,
            LY_STMT_IMPORT, submod->prefix, &submod->imports, 0,
            LY_STMT_INCLUDE, submod->name, &submod->includes, 0,
            LY_STMT_LEAF, &submod->data, 0,
            LY_STMT_LEAF_LIST, &submod->data, 0,
            LY_STMT_LIST, &submod->data, 0,
            LY_STMT_NOTIFICATION, &submod->notifs, 0,
            LY_STMT_ORGANIZATION, &submod->org, YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &submod->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_REVISION, &submod->revs, 0,
            LY_STMT_RPC, &submod->rpcs, 0,
            LY_STMT_TYPEDEF, &submod->typedefs, 0,
            LY_STMT_USES, &submod->data, 0,
            LY_STMT_YANG_VERSION, &submod->version, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));

    ret = yin_parse_content(ctx, subelems, subelems_size, submod, LY_STMT_SUBMODULE, NULL, &submod->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, submod->exts));

    /* submodules share the namespace with the module names, so there must not be
     * a submodule of the same name in the context, no need for revision matching */
    dup = ly_ctx_get_submodule_latest(ctx->xmlctx->ctx, submod->name);
    if (dup && strcmp(dup->mod->name, submod->mod->name)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_NAME_COL, "submodules", dup->name);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}